

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q1b_grandfather.cpp
# Opt level: O3

void solve(unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
           *d)

{
  istream *piVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  long lVar4;
  char *pcVar5;
  longlong b;
  longlong a;
  long local_28;
  long local_20;
  
  piVar1 = std::istream::_M_extract<long_long>(&std::cin);
  std::istream::_M_extract<long_long>((longlong *)piVar1);
  if (local_20 != local_28) {
    cVar2 = std::
            _Hashtable<long_long,_std::pair<const_long_long,_long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&d->_M_h,&local_20);
    cVar3 = std::
            _Hashtable<long_long,_std::pair<const_long_long,_long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&d->_M_h,&local_28);
    if (cVar3.super__Node_iterator_base<std::pair<const_long_long,_long_long>,_false>._M_cur !=
        (__node_type *)0x0 &&
        cVar2.super__Node_iterator_base<std::pair<const_long_long,_long_long>,_false>._M_cur !=
        (__node_type *)0x0) {
      cVar2 = std::
              _Hashtable<long_long,_std::pair<const_long_long,_long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&d->_M_h,(key_type *)
                              ((long)cVar2.
                                     super__Node_iterator_base<std::pair<const_long_long,_long_long>,_false>
                                     ._M_cur + 0x10));
      cVar3 = std::
              _Hashtable<long_long,_std::pair<const_long_long,_long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&d->_M_h,(key_type *)
                              ((long)cVar3.
                                     super__Node_iterator_base<std::pair<const_long_long,_long_long>,_false>
                                     ._M_cur + 0x10));
      if ((cVar3.super__Node_iterator_base<std::pair<const_long_long,_long_long>,_false>._M_cur !=
           (__node_type *)0x0 &&
           cVar2.super__Node_iterator_base<std::pair<const_long_long,_long_long>,_false>._M_cur !=
           (__node_type *)0x0) &&
         (*(long *)((long)cVar2.
                          super__Node_iterator_base<std::pair<const_long_long,_long_long>,_false>.
                          _M_cur + 0x10) ==
          *(long *)((long)cVar3.
                          super__Node_iterator_base<std::pair<const_long_long,_long_long>,_false>.
                          _M_cur + 0x10))) {
        pcVar5 = "YES\n";
        lVar4 = 4;
        goto LAB_00101396;
      }
    }
  }
  pcVar5 = "NO\n";
  lVar4 = 3;
LAB_00101396:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar4);
  return;
}

Assistant:

void solve(const unordered_map<long long, long long> &d) {
    auto e = d.end();

    long long a, b;
    cin >> a >> b;
    if (a == b) {
        cout << "NO\n";
        return;
    }
    auto da = d.find(a), db = d.find(b);
    if (da == e || db == e) {
        cout << "NO\n";
        return;
    }

    auto dda = d.find(da->second), ddb = d.find(db->second);
    if (dda == e || ddb == e) {
        cout << "NO\n";
        return;
    }

    if (dda->second == ddb->second) {
        cout << "YES\n";
        return;
    }
    cout << "NO\n";
}